

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QCss::Declaration>::growAppend
          (QCommonArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  long n;
  Declaration *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::Declaration> local_48;
  Declaration *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 3;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (Declaration *)0x0;
    pDVar1 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
             super_QArrayDataPointer<QCss::Declaration>.ptr;
    if ((b < pDVar1) ||
       (pDVar1 + (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
                 super_QArrayDataPointer<QCss::Declaration>.size <= b)) {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                ((QArrayDataPointer<QCss::Declaration> *)this,GrowsAtEnd,n,(Declaration **)0x0,
                 (QArrayDataPointer<QCss::Declaration> *)0x0);
      pDVar1 = b;
    }
    else {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                ((QArrayDataPointer<QCss::Declaration> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pDVar1 = local_28;
    }
    QGenericArrayOps<QCss::Declaration>::copyAppend
              ((QGenericArrayOps<QCss::Declaration> *)this,pDVar1,
               (Declaration *)(((long)e - (long)b) + (long)pDVar1));
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }